

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_buffer.h
# Opt level: O1

StringBuffer * __thiscall MeCab::StringBuffer::operator<<(StringBuffer *this,unsigned_long n)

{
  byte bVar1;
  StringBuffer *pSVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *__n;
  ulong in_RDX;
  bool bVar5;
  char fbuf [64];
  byte local_48 [72];
  
  pbVar3 = local_48;
  pbVar4 = local_48;
  if (n != 0) {
    do {
      in_RDX = n / 10;
      *pbVar3 = (char)n + (char)in_RDX * -10 | 0x30;
      pbVar4 = pbVar3 + 1;
      bVar5 = 9 < n;
      pbVar3 = pbVar4;
      n = in_RDX;
    } while (bVar5);
  }
  if (pbVar4 == local_48) {
    *pbVar4 = 0x30;
    pbVar4 = pbVar4 + 1;
  }
  *pbVar4 = 0;
  pbVar3 = (byte *)CONCAT71((int7)(in_RDX >> 8),pbVar4 != local_48);
  __n = pbVar4 + -1;
  if (local_48 < __n && pbVar4 != local_48) {
    pbVar4 = local_48 + 1;
    do {
      bVar1 = pbVar4[-1];
      pbVar4[-1] = *__n;
      *__n = bVar1;
      __n = __n + -1;
      pbVar3 = pbVar4 + 1;
      bVar5 = pbVar4 < __n;
      pbVar4 = pbVar3;
    } while (bVar5);
  }
  pSVar2 = (StringBuffer *)write(this,(int)local_48,pbVar3,(size_t)__n);
  return pSVar2;
}

Assistant:

StringBuffer& operator<<(unsigned long int n)  { _UITOA(n); }